

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

char * String::findLastOf(char *in,char *chars)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = strpbrk(in,chars);
  pcVar2 = (char *)0x0;
  while (pcVar1 != (char *)0x0) {
    pcVar3 = strpbrk(pcVar1 + 1,chars);
    pcVar2 = pcVar1;
    pcVar1 = pcVar3;
  }
  return pcVar2;
}

Assistant:

const char* String::findLastOf(const char* in, const char* chars)
{
  const char* result = 0;
  const char* match = strpbrk(in, chars);
  for(;;)
  {
    if(!match)
      return result;
    result = match;
    match = strpbrk(match + 1, chars);
  }
}